

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

StructUnionTypeSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::StructUnionTypeSyntax,slang::syntax::StructUnionTypeSyntax_const&>
          (BumpAllocator *this,StructUnionTypeSyntax *args)

{
  StructUnionTypeSyntax *pSVar1;
  StructUnionTypeSyntax *in_RSI;
  size_t in_RDI;
  size_t unaff_retaddr;
  
  pSVar1 = (StructUnionTypeSyntax *)allocate((BumpAllocator *)args,unaff_retaddr,in_RDI);
  slang::syntax::StructUnionTypeSyntax::StructUnionTypeSyntax(in_RSI,pSVar1);
  return pSVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }